

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O0

size_t __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::splitPartition(PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
                 *this,size_t partitionId)

{
  value_type vVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  PartitionGraph *pPVar5;
  back_insert_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> partitionId_00;
  size_type sVar6;
  value_type __n;
  reference pvVar7;
  size_type in_RSI;
  long *in_RDI;
  long lVar8;
  double dVar9;
  double next;
  unsigned_long *v_4;
  iterator __end3_3;
  iterator __begin3_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_3;
  value_type_conflict *v_3;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range4_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *partition_1;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *__range3_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  VertexIterator it;
  unsigned_long *v_2;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  value_type_conflict *v_1;
  const_iterator __end5;
  const_iterator __begin5;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range5;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *partition;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *__range4;
  double proposedObjective;
  double dLocalBranchingObj;
  double localBranchingObj;
  double dInternalObj;
  unsigned_long *v;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  Move best;
  size_t iter;
  size_t maxMoves;
  vector<unsigned_long,_std::allocator<unsigned_long>_> borderVertices;
  double bestBranchingObjective;
  double bestInternalObjective;
  size_t bestNumberOfMoves;
  Cost bestObjective;
  value_type *partitionB;
  value_type *partitionA;
  size_t newPartition;
  size_t numberOfMoves;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffb48;
  Move *in_stack_fffffffffffffb50;
  value_type_conflict *in_stack_fffffffffffffb58;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *in_stack_fffffffffffffb60;
  back_insert_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffb68;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffffb70;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffffb78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffb80;
  size_t in_stack_fffffffffffffb90;
  size_t in_stack_fffffffffffffb98;
  PartitionGraph *local_458;
  PartitionGraph *in_stack_fffffffffffffbb0;
  unsigned_long *local_408;
  byte local_3b9;
  PartitionGraph *pPVar10;
  reference local_378;
  reference local_368;
  unsigned_long *local_360;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_358;
  undefined1 *local_350;
  size_type *local_348;
  _Node_iterator_base<unsigned_long,_false> local_340;
  _Node_iterator_base<unsigned_long,_false> local_338;
  const_iterator local_330;
  const_iterator local_328;
  const_iterator local_320;
  const_iterator local_318;
  undefined1 *local_310;
  undefined1 local_308 [112];
  undefined1 local_298 [96];
  size_type *local_238;
  _Node_iterator_base<unsigned_long,_false> local_230;
  _Node_iterator_base<unsigned_long,_false> local_228;
  Data *local_220;
  Data *local_218;
  Data *local_210;
  Data *local_208;
  unsigned_long *local_200;
  unsigned_long local_1f8 [7];
  unsigned_long local_1c0 [5];
  _Bit_type *in_stack_fffffffffffffe68;
  size_t in_stack_fffffffffffffe70;
  PartitionGraph *in_stack_fffffffffffffe78;
  Move local_170;
  Cost local_148;
  double local_140;
  double local_138;
  double local_130;
  size_t *local_128;
  unsigned_long *local_120;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_110;
  undefined1 local_108 [16];
  long local_f8;
  long local_f0;
  double local_e8;
  ulong local_e0;
  size_t local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b8;
  _Node_iterator_base<unsigned_long,_false> local_b0;
  _Node_iterator_base<unsigned_long,_false> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  long local_88;
  long local_80;
  size_t local_78;
  double local_70;
  reference local_68;
  reference local_60;
  reference local_58;
  undefined1 local_41;
  reference local_40;
  undefined1 local_29;
  PartitionGraph *local_28;
  size_t local_20;
  size_type local_18;
  size_t local_8;
  
  local_20 = 0;
  local_18 = in_RSI;
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                *)(in_RDI + 0x13),in_RSI);
  sVar4 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)0x1db403);
  if (sVar4 < 2) {
    local_8 = local_20;
  }
  else {
    for (local_28 = (PartitionGraph *)0x0; pPVar10 = local_28,
        pPVar5 = (PartitionGraph *)
                 andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                 numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                                  0x1db44b), pPVar10 < pPVar5;
        local_28 = (PartitionGraph *)
                   ((long)&(local_28->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>
                           ).vertices_.
                           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1)) {
      std::
      vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 0x13),(size_type)local_28);
      bVar2 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x1db483);
      if (bVar2) break;
    }
    pPVar10 = local_28;
    pPVar5 = (PartitionGraph *)
             andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
             numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1db4c4);
    if (pPVar10 == pPVar5) {
      PartitionGraph::addVertex(in_stack_fffffffffffffbb0);
      local_29 = 0;
      local_40 = std::vector<bool,_std::allocator<bool>_>::emplace_back<bool>
                           ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffb50,
                            (bool *)in_stack_fffffffffffffb48);
      local_41 = 0;
      local_58 = std::vector<bool,_std::allocator<bool>_>::emplace_back<bool>
                           ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffb50,
                            (bool *)in_stack_fffffffffffffb48);
    }
    local_60 = std::
               vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                             *)(in_RDI + 0x13),local_18);
    local_68 = std::
               vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                             *)(in_RDI + 0x13),(size_type)local_28);
    local_70 = (double)(**(code **)(*in_RDI + 0x10))();
    local_78 = 0;
    local_80 = in_RDI[0x19];
    local_88 = in_RDI[0x1a];
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1db5fb);
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::cbegin(in_stack_fffffffffffffb48);
    local_b0._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::cend(in_stack_fffffffffffffb48);
    partitionId_00 =
         std::back_inserter<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffb48);
    local_b8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)partitionId_00;
    local_d0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::
               copy<std::__detail::_Node_const_iterator<unsigned_long,true,false>,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         ((_Node_const_iterator<unsigned_long,_true,_false>)
                          in_stack_fffffffffffffb78._M_cur,
                          (_Node_const_iterator<unsigned_long,_true,_false>)
                          in_stack_fffffffffffffb70._M_cur,in_stack_fffffffffffffb68);
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_a0);
    if (sVar6 < 3) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1db6a3);
    }
    lVar8 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_18,local_28);
    in_RDI[0x1c] = lVar8;
    sVar4 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x1db710);
    local_d8 = calcMaximumMoves(sVar4,0);
    local_e0 = 0;
    while( true ) {
      local_3b9 = 0;
      if (local_e0 < local_d8 + 1) {
        bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb60);
        local_3b9 = bVar2 ^ 0xff;
      }
      if ((local_3b9 & 1) == 0) break;
      Move::Move(in_stack_fffffffffffffb50);
      local_110 = &local_a0;
      local_118._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffb48);
      local_120 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffb48);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffb50,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffb48), bVar2) {
        local_128 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_118);
        local_130 = PartitionGraph::move
                              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                               (size_t)in_stack_fffffffffffffe68);
        uVar3 = std::isinf(local_130);
        if ((uVar3 & 1) == 0) {
          local_138 = (double)(**(code **)(*in_RDI + 0x18))(in_RDI,local_18,local_28);
          local_140 = local_138 - (double)in_RDI[0x1c];
          dVar9 = (double)(**(code **)(*in_RDI + 0x10))();
          local_148 = dVar9 + local_130 + local_140;
          bVar2 = lowerThanWithEpsilon(local_e8,local_148);
          if (bVar2) {
            Move::Move(&local_170,*local_128,0,local_138,(double)in_RDI[0x1a] + local_140,local_148)
            ;
            memcpy(local_108,&local_170,0x28);
          }
          PartitionGraph::move
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                     (size_t)in_stack_fffffffffffffe68);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_118);
      }
      uVar3 = std::isinf(local_e8);
      if ((uVar3 & 1) != 0) break;
      applySingleMove(in_stack_fffffffffffffb60,(size_t)in_stack_fffffffffffffb58,
                      (size_t)in_stack_fffffffffffffb50);
      dVar9 = local_70;
      in_RDI[0x1c] = local_f8;
      in_RDI[0x1a] = local_f0;
      local_20 = local_20 + 1;
      next = (double)(**(code **)(*in_RDI + 0x10))();
      bVar2 = lowerThanWithEpsilon(dVar9,next);
      if (bVar2) {
        local_70 = (double)(**(code **)(*in_RDI + 0x10))();
        local_78 = local_20;
        local_80 = in_RDI[0x19];
        local_88 = in_RDI[0x1a];
        local_200 = local_1f8;
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        local_200 = local_1c0;
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        in_stack_fffffffffffffe78 = (PartitionGraph *)local_1f8;
        local_208 = (Data *)std::
                            initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                            ::begin((initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                                     *)&stack0xfffffffffffffe78);
        local_210 = (Data *)std::
                            initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                            ::end((initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                                   *)in_stack_fffffffffffffb50);
        for (; local_208 != local_210; local_208 = (Data *)&local_208->enforceBifurcationConstraint)
        {
          local_218 = local_208;
          local_220 = local_208;
          local_228._M_cur =
               (__node_type *)
               std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::begin(in_stack_fffffffffffffb48);
          local_230._M_cur =
               (__node_type *)
               std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::end(in_stack_fffffffffffffb48);
          while (bVar2 = std::__detail::operator!=(&local_228,&local_230), bVar2) {
            local_238 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*
                                  ((_Node_const_iterator<unsigned_long,_true,_false> *)0x1dbc9c);
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x16),*local_238);
            vVar1 = *pvVar7;
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x31),*local_238);
            *pvVar7 = vVar1;
            std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++
                      ((_Node_const_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffffb50
                      );
          }
        }
        local_408 = (unsigned_long *)&stack0xfffffffffffffe78;
        do {
          local_408 = local_408 + -7;
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)0x1dbd42);
        } while (local_408 != local_1f8);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1dbd70);
      sVar4 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)0x1dbd7d);
      if (sVar4 < 2) break;
      local_298._88_8_ = local_60;
      local_298._80_8_ =
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin(in_stack_fffffffffffffb48);
      local_298._72_8_ =
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end(in_stack_fffffffffffffb48);
      while (bVar2 = std::__detail::operator!=
                               ((_Node_iterator_base<unsigned_long,_false> *)(local_298 + 0x50),
                                (_Node_iterator_base<unsigned_long,_false> *)(local_298 + 0x48)),
            bVar2) {
        local_298._64_8_ =
             std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                       ((_Node_iterator<unsigned_long,_true,_false> *)0x1dbded);
        ProblemGraph::graph(*(ProblemGraph **)in_RDI[1]);
        andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
        verticesFromVertexBegin
                  ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                   in_stack_fffffffffffffb68.container,(size_t)in_stack_fffffffffffffb60);
        while( true ) {
          ProblemGraph::graph(*(ProblemGraph **)in_RDI[1]);
          andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
          verticesFromVertexEnd
                    ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                     in_stack_fffffffffffffb68.container,(size_t)in_stack_fffffffffffffb60);
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                              *)in_stack_fffffffffffffb50,
                             (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                              *)in_stack_fffffffffffffb48);
          if (!bVar2) break;
          __n = andres::graph::detail::IteratorHelper<true>::operator*
                          ((IteratorHelper<true> *)0x1dbe97);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x16),__n);
          if ((PartitionGraph *)*pvVar7 == local_28) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
            break;
          }
          andres::graph::detail::IteratorHelper<true>::operator++
                    ((IteratorHelper<true> *)in_stack_fffffffffffffb50);
        }
        std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                  ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffffb50);
      }
      local_e0 = local_e0 + 1;
    }
    if (local_78 < local_20) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1dbf44);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x1dbf51);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x1dbf63);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78._M_cur);
      local_310 = local_308;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_310 = local_308 + 0x38;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_298._0_8_ = local_308;
      local_298._8_8_ = (Data *)0x2;
      local_298._16_8_ = local_298;
      local_318 = std::
                  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  ::begin((initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                           *)local_298._16_8_);
      local_320 = std::
                  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  ::end((initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                         *)in_stack_fffffffffffffb50);
      for (; local_318 != local_320; local_318 = local_318 + 1) {
        local_328 = local_318;
        local_330 = local_318;
        local_338._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::begin(in_stack_fffffffffffffb48);
        local_340._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::end(in_stack_fffffffffffffb48);
        while (bVar2 = std::__detail::operator!=(&local_338,&local_340), bVar2) {
          local_348 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*
                                ((_Node_const_iterator<unsigned_long,_true,_false> *)0x1dc127);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x31),*local_348);
          vVar1 = *pvVar7;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x16),*local_348);
          if (vVar1 != *pvVar7) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          }
          std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++
                    ((_Node_const_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffffb50);
        }
      }
      pPVar5 = (PartitionGraph *)local_308;
      local_458 = (PartitionGraph *)local_298;
      do {
        in_stack_fffffffffffffb70._M_cur = (__node_type *)&local_458[-1].data_;
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x1dc20d);
        local_458 = (PartitionGraph *)in_stack_fffffffffffffb70._M_cur;
      } while ((PartitionGraph *)in_stack_fffffffffffffb70._M_cur != pPVar5);
      local_350 = local_298 + 0x18;
      local_358._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffb48);
      local_360 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffb48);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffb50,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffb48), bVar2) {
        local_368 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_358);
        in_stack_fffffffffffffb60 =
             (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
              *)*local_368;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x31),
                   (size_type)in_stack_fffffffffffffb60);
        PartitionGraph::forceMove(pPVar5,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_358);
      }
      PartitionGraph::updateEdgesOfPartition(pPVar10,(size_t)partitionId_00.container);
      PartitionGraph::updateEdgesOfPartition(pPVar10,(size_t)partitionId_00.container);
      in_RDI[0x19] = local_80;
      in_RDI[0x1a] = local_88;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb60)
      ;
    }
    if (local_78 != 0) {
      local_378 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffb70._M_cur
                             ,(size_type)in_stack_fffffffffffffb68.container);
      std::_Bit_reference::operator=(&local_378,true);
    }
    local_8 = local_78;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb60);
  }
  return local_8;
}

Assistant:

inline size_t
PartitionOptimizerBase<BROPT>::splitPartition(size_t partitionId)
{
    size_t numberOfMoves = 0;

    // skip single-node partitions.
    if (partitionGraph_.partitions_[partitionId].size() <= 1) {
        return numberOfMoves;
    }

    // find empty partitions that could be used.
    size_t newPartition = 0;
    for (; newPartition < partitionGraph_.numberOfVertices(); ++newPartition) {
        if (partitionGraph_.partitions_[newPartition].empty()) {
            break;
        }
    }

    // or insert a new one and extend vectors with dirty flags.
    if (newPartition == partitionGraph_.numberOfVertices()) {
        partitionGraph_.addVertex();
        changed_.emplace_back(false);
        needsUpdate_.emplace_back(false);
    }

    auto& partitionA = partitionGraph_.partitions_[partitionId];
    auto& partitionB = partitionGraph_.partitions_[newPartition];

    auto bestObjective = getObjective();
    size_t bestNumberOfMoves = 0;
    auto bestInternalObjective = internalObjective_;
    auto bestBranchingObjective = branchingObjective_;

    // move(..) checks if partitions are broken apart, so for now,
    // we can consider all vertices as potential candidates.
    std::vector<size_t> borderVertices;
    std::copy(partitionA.cbegin(), partitionA.cend(),
              std::back_inserter(borderVertices));

    assert(partitionA.size() > 1);
    assert(borderVertices.size() == partitionA.size());

    // ...but if there are only two nodes, then we have to check only one of
    // them!
    if (borderVertices.size() <= 2) {
        borderVertices.pop_back();
    }

    localBranchingObjective_ =
        getBaselineBranchingObjective(partitionId, newPartition);

    const size_t maxMoves = calcMaximumMoves(partitionA.size(), 0);
    for (size_t iter = 0; iter < maxMoves + 1 && !borderVertices.empty();
         ++iter) {

        Move best;

        for (const auto& v : borderVertices) {

            // move v to new partition and calculate gain.
            const double dInternalObj = partitionGraph_.move(v, newPartition);

            if (std::isinf(dInternalObj)) {
                continue;
            }

            const auto localBranchingObj =
                solveLocalBranchingProblem(partitionId, newPartition);

            const auto dLocalBranchingObj =
                (localBranchingObj - localBranchingObjective_);

            const auto proposedObjective =
                getObjective() + dInternalObj + dLocalBranchingObj;

            if (lowerThanWithEpsilon(best.obj_, proposedObjective)) {
                best = { v, 0, localBranchingObj,
                         branchingObjective_ + dLocalBranchingObj,
                         proposedObjective }; // we dont need best.other_ here
                                              // as we always move to
                                              // newPartition.
            }

            // undo move.
            partitionGraph_.move(v, partitionId);
        }

        if (std::isinf(best.obj_)) {
            break;
        }

        applySingleMove(best.vertex_, newPartition);
        localBranchingObjective_ = best.localBranchingObj_;
        branchingObjective_ = best.branchingObj_;

        ++numberOfMoves;

        // keep track of the best labeling.
        if (lowerThanWithEpsilon(bestObjective, getObjective())) {

            bestObjective = getObjective();
            bestNumberOfMoves = numberOfMoves;
            bestInternalObjective = internalObjective_;
            bestBranchingObjective = branchingObjective_;

            // update best vertex labeling.
            for (const auto& partition : { partitionA, partitionB }) {
                for (const auto& v : partition) {
                    bestVertexLabels_[v] = partitionGraph_.vertexLabels_[v];
                }
            }
        }

        // collect border vertices again.
        borderVertices.clear();
        if (partitionA.size() <= 1) {
            break;
        }
        for (const auto& v : partitionA) {
            for (auto it =
                     this->data_.problemGraph.graph().verticesFromVertexBegin(
                         v);
                 it !=
                 this->data_.problemGraph.graph().verticesFromVertexEnd(v);
                 ++it) {
                if (partitionGraph_.vertexLabels_[*it] == newPartition) {
                    borderVertices.push_back(v);
                    break;
                }
            }
        }
    }

    // revert to best labeling.
    if (numberOfMoves > bestNumberOfMoves) {

        std::vector<size_t> buffer;
        buffer.reserve(partitionA.size() + partitionB.size());

        for (const auto& partition : { partitionA, partitionB }) {
            for (const auto& v : partition) {
                if (bestVertexLabels_[v] != partitionGraph_.vertexLabels_[v]) {
                    buffer.push_back(v);
                }
            }
        }

        // revert partitions and labels.
        for (const auto& v : buffer) {
            partitionGraph_.forceMove(v, bestVertexLabels_[v]);
        }

        // update branching edges.
        partitionGraph_.updateEdgesOfPartition(partitionId);
        partitionGraph_.updateEdgesOfPartition(newPartition);

        // and revert partial objectives.
        internalObjective_ = bestInternalObjective;
        branchingObjective_ = bestBranchingObjective;
    }

    if (bestNumberOfMoves > 0) {
        changed_[newPartition] = true;
    }

    return bestNumberOfMoves;
}